

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O1

void __thiscall OpenMD::ShellStatistics::processFrame(ShellStatistics *this,int istep)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  StuntDouble *pSVar6;
  SelectionSet *i;
  long lVar7;
  int isd;
  SelectionSet local_30;
  
  if ((this->comEvaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_30,&this->comEvaluator_);
    lVar7 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->comSeleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar7),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_30.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar7));
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_30.bitsets_);
    iVar4 = OpenMDBitSet::countBits
                      ((this->comSeleMan_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 != 1) {
      uVar5 = OpenMDBitSet::countBits
                        ((this->comSeleMan_).ss_.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      snprintf(painCave.errMsg,2000,
               "ShellStatistics: More than one selected object in comsele.\n\tThere are %d selected objects.\n"
               ,(ulong)uVar5);
      painCave.isFatal = 1;
      simError();
    }
    i = &local_30;
    pSVar6 = SelectionManager::beginSelected(&this->comSeleMan_,(int *)i);
    lVar7 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
    dVar2 = *(double *)(lVar7 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar7 + (long)pSVar6->localIndex_ * 0x18);
    dVar3 = pdVar1[1];
    (this->coordinateOrigin_).super_Vector<double,_3U>.data_[0] = *pdVar1;
    (this->coordinateOrigin_).super_Vector<double,_3U>.data_[1] = dVar3;
    (this->coordinateOrigin_).super_Vector<double,_3U>.data_[2] = dVar2;
    SpatialStatistics::processFrame(&this->super_SpatialStatistics,(int)i);
  }
  return;
}

Assistant:

void ShellStatistics::processFrame(int istep) {
    if (comEvaluator_.isDynamic()) {
      comSeleMan_.setSelectionSet(comEvaluator_.evaluate());
      if (comSeleMan_.getSelectionCount() != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ShellStatistics: More than one selected object in "
                 "comsele.\n"
                 "\tThere are %d selected objects.\n",
                 comSeleMan_.getSelectionCount());
        painCave.isFatal = 1;
        simError();
      }
      int isd;
      StuntDouble* sd   = comSeleMan_.beginSelected(isd);
      coordinateOrigin_ = sd->getPos();

      SpatialStatistics::processFrame(istep);
    }
  }